

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jwt.h
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
jwt::claim::as_set_abi_cxx11_
          (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,claim *this)

{
  bool bVar1;
  array *this_00;
  reference this_01;
  bad_cast *this_02;
  string *__x;
  value *e;
  const_iterator __end2;
  const_iterator __begin2;
  array *__range2;
  claim *this_local;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *res;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(__return_storage_ptr__);
  this_00 = as_array(this);
  __end2 = std::vector<picojson::value,_std::allocator<picojson::value>_>::begin(this_00);
  e = (value *)std::vector<picojson::value,_std::allocator<picojson::value>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
                                *)&e);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    this_01 = __gnu_cxx::
              __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
              ::operator*(&__end2);
    bVar1 = picojson::value::is<std::__cxx11::string>(this_01);
    if (!bVar1) break;
    __x = picojson::value::get<std::__cxx11::string>(this_01);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(__return_storage_ptr__,__x);
    __gnu_cxx::
    __normal_iterator<const_picojson::value_*,_std::vector<picojson::value,_std::allocator<picojson::value>_>_>
    ::operator++(&__end2);
  }
  this_02 = (bad_cast *)__cxa_allocate_exception(8);
  std::bad_cast::bad_cast(this_02);
  __cxa_throw(this_02,&std::bad_cast::typeinfo,std::bad_cast::~bad_cast);
}

Assistant:

const std::set<std::string> as_set() const {
			std::set<std::string> res;
			for(auto& e : as_array()) {
				if(!e.is<std::string>())
					throw std::bad_cast();
				res.insert(e.get<std::string>());
			}
			return res;
		}